

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

void __thiscall
spvtools::opt::Loop::GetInductionVariables
          (Loop *this,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *induction_variables)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  Instruction *inst;
  Instruction *local_28;
  
  pBVar1 = this->loop_header_;
  for (pIVar2 = (pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      pIVar2 != &(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      pIVar2 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
    if (pIVar2->opcode_ == OpPhi) {
      local_28 = pIVar2;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 induction_variables,&local_28);
    }
  }
  return;
}

Assistant:

void Loop::GetInductionVariables(
    std::vector<Instruction*>& induction_variables) const {
  for (Instruction& inst : *loop_header_) {
    if (inst.opcode() == spv::Op::OpPhi) {
      induction_variables.push_back(&inst);
    }
  }
}